

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O2

Result __thiscall wabt::WastParser::ParseImportModuleField(WastParser *this,Module *module)

{
  ImportModuleField *pIVar1;
  FuncImport *pFVar2;
  bool bVar3;
  Result RVar4;
  Result RVar5;
  TokenType TVar6;
  _Head_base<0UL,_wabt::EventImport_*,_false> *args;
  long lVar7;
  wabt *this_00;
  allocator local_122;
  allocator local_121;
  _Head_base<0UL,_wabt::EventImport_*,_false> local_120;
  undefined1 local_118 [64];
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  _Head_base<0UL,_wabt::ImportModuleField_*,_false> local_b8;
  string name;
  Location loc;
  string field_name;
  string module_name;
  
  RVar4 = Expect(this,Lpar);
  if (RVar4.enum_ == Error) {
    return (Result)Error;
  }
  GetLocation(&loc,this);
  CheckImportOrdering(this,module);
  RVar4 = Expect(this,Import);
  if (RVar4.enum_ == Error) {
    return (Result)Error;
  }
  module_name._M_dataplus._M_p = (pointer)&module_name.field_2;
  module_name._M_string_length = 0;
  module_name.field_2._M_local_buf[0] = '\0';
  field_name._M_dataplus._M_p = (pointer)&field_name.field_2;
  field_name._M_string_length = 0;
  field_name.field_2._M_local_buf[0] = '\0';
  RVar5 = ParseQuotedText(this,&module_name);
  RVar4.enum_ = Error;
  if (((RVar5.enum_ == Error) || (RVar5 = ParseQuotedText(this,&field_name), RVar5.enum_ == Error))
     || (RVar5 = Expect(this,Lpar), RVar5.enum_ == Error)) goto LAB_00179aef;
  name._M_dataplus._M_p = (pointer)&name.field_2;
  name._M_string_length = 0;
  name.field_2._M_local_buf[0] = '\0';
  TVar6 = Peek(this,0);
  if (TVar6 == Event) {
    Consume((Token *)local_118,this);
    ParseBindVarOpt(this,&name);
    MakeUnique<wabt::EventImport,std::__cxx11::string&>((wabt *)local_118,&name);
    RVar4 = ParseTypeUseOpt(this,&((Event *)(local_118._0_8_ + 0x50))->decl);
    if (((RVar4.enum_ == Error) ||
        (RVar4 = ParseUnboundFuncSignature(this,&(((Event *)(local_118._0_8_ + 0x50))->decl).sig),
        RVar4.enum_ == Error)) || (RVar4 = Expect(this,Rpar), RVar4.enum_ == Error))
    goto LAB_00179ad7;
    this_00 = (wabt *)&local_d8;
    args = (_Head_base<0UL,_wabt::EventImport_*,_false> *)local_118;
    MakeUnique<wabt::ImportModuleField,std::unique_ptr<wabt::EventImport,std::default_delete<wabt::EventImport>>,wabt::Location&>
              (this_00,(unique_ptr<wabt::EventImport,_std::default_delete<wabt::EventImport>_> *)
                       args,&loc);
LAB_00179c1b:
    pIVar1 = *(ImportModuleField **)this_00;
    pFVar2 = ((_Head_base<0UL,_wabt::FuncImport_*,_false> *)
             &(((__uniq_ptr_data<wabt::EventImport,_std::default_delete<wabt::EventImport>,_true,_true>
                 *)&args->_M_head_impl)->
              super___uniq_ptr_impl<wabt::EventImport,_std::default_delete<wabt::EventImport>_>).
              _M_t.
              super__Tuple_impl<0UL,_wabt::EventImport_*,_std::default_delete<wabt::EventImport>_>.
              super__Head_base<0UL,_wabt::EventImport_*,_false>)->_M_head_impl;
    if (pFVar2 != (FuncImport *)0x0) {
      (**(code **)(*(long *)&((ImportMixin<(wabt::ExternalKind)1> *)
                             &pFVar2->super_ImportMixin<(wabt::ExternalKind)0>)->super_Import + 8))
                ();
    }
    std::__cxx11::string::_M_assign
              ((string *)
               &((pIVar1->import)._M_t.
                 super___uniq_ptr_impl<wabt::Import,_std::default_delete<wabt::Import>_>._M_t.
                 super__Tuple_impl<0UL,_wabt::Import_*,_std::default_delete<wabt::Import>_>.
                 super__Head_base<0UL,_wabt::Import_*,_false>._M_head_impl)->module_name);
    std::__cxx11::string::_M_assign
              ((string *)
               &((pIVar1->import)._M_t.
                 super___uniq_ptr_impl<wabt::Import,_std::default_delete<wabt::Import>_>._M_t.
                 super__Tuple_impl<0UL,_wabt::Import_*,_std::default_delete<wabt::Import>_>.
                 super__Head_base<0UL,_wabt::Import_*,_false>._M_head_impl)->field_name);
    local_b8._M_head_impl = pIVar1;
    Module::AppendField(module,(unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
                                *)&local_b8);
    if (local_b8._M_head_impl != (ImportModuleField *)0x0) {
      (*((local_b8._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).
        super_ModuleField._vptr_ModuleField[1])();
    }
    local_b8._M_head_impl = (ImportModuleField *)0x0;
    RVar4 = Expect(this,Rpar);
    RVar4.enum_ = (Enum)(RVar4.enum_ == Error);
  }
  else {
    if (TVar6 == Table) {
      Consume((Token *)local_118,this);
      ParseBindVarOpt(this,&name);
      MakeUnique<wabt::TableImport,std::__cxx11::string&>((wabt *)local_118,&name);
      RVar4 = ParseLimits(this,(Limits *)&((Event *)(local_118._0_8_ + 0x50))->decl);
      if (((RVar4.enum_ != Error) &&
          (RVar4 = ParseRefType(this,(Type *)&(((Event *)(local_118._0_8_ + 0x50))->decl).type_var.
                                              loc.field_1.field_0), RVar4.enum_ != Error)) &&
         (RVar4 = Expect(this,Rpar), RVar4.enum_ != Error)) {
        this_00 = (wabt *)&local_d8;
        args = (_Head_base<0UL,_wabt::EventImport_*,_false> *)local_118;
        MakeUnique<wabt::ImportModuleField,std::unique_ptr<wabt::TableImport,std::default_delete<wabt::TableImport>>,wabt::Location&>
                  (this_00,(unique_ptr<wabt::TableImport,_std::default_delete<wabt::TableImport>_> *
                           )args,&loc);
        goto LAB_00179c1b;
      }
    }
    else if (TVar6 == Global) {
      Consume((Token *)local_118,this);
      ParseBindVarOpt(this,&name);
      MakeUnique<wabt::GlobalImport,std::__cxx11::string&>((wabt *)local_118,&name);
      RVar4 = ParseGlobalType(this,(Global *)(local_118._0_8_ + 0x50));
      if ((RVar4.enum_ != Error) && (RVar4 = Expect(this,Rpar), RVar4.enum_ != Error)) {
        this_00 = (wabt *)&local_d8;
        args = (_Head_base<0UL,_wabt::EventImport_*,_false> *)local_118;
        MakeUnique<wabt::ImportModuleField,std::unique_ptr<wabt::GlobalImport,std::default_delete<wabt::GlobalImport>>,wabt::Location&>
                  (this_00,(unique_ptr<wabt::GlobalImport,_std::default_delete<wabt::GlobalImport>_>
                            *)args,&loc);
        goto LAB_00179c1b;
      }
    }
    else if (TVar6 == Memory) {
      Consume((Token *)local_118,this);
      ParseBindVarOpt(this,&name);
      MakeUnique<wabt::MemoryImport,std::__cxx11::string&>((wabt *)local_118,&name);
      RVar4 = ParseLimits(this,(Limits *)&((Event *)(local_118._0_8_ + 0x50))->decl);
      if ((RVar4.enum_ != Error) && (RVar4 = Expect(this,Rpar), RVar4.enum_ != Error)) {
        this_00 = (wabt *)&local_d8;
        args = (_Head_base<0UL,_wabt::EventImport_*,_false> *)local_118;
        MakeUnique<wabt::ImportModuleField,std::unique_ptr<wabt::MemoryImport,std::default_delete<wabt::MemoryImport>>,wabt::Location&>
                  (this_00,(unique_ptr<wabt::MemoryImport,_std::default_delete<wabt::MemoryImport>_>
                            *)args,&loc);
        goto LAB_00179c1b;
      }
    }
    else {
      if (TVar6 != Func) {
        std::__cxx11::string::string((string *)local_118,"an external kind",(allocator *)&local_120)
        ;
        local_d8 = 0;
        uStack_d0 = 0;
        local_c8 = 0;
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        _M_range_initialize<std::__cxx11::string_const*>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_d8,
                   (string *)local_118,local_118 + 0x20);
        RVar4 = ErrorExpected(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)&local_d8,(char *)0x0);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_d8);
        std::__cxx11::string::_M_dispose();
        goto LAB_00179ae5;
      }
      Consume((Token *)local_118,this);
      ParseBindVarOpt(this,&name);
      MakeUnique<wabt::FuncImport,std::__cxx11::string&>((wabt *)&local_120,&name);
      bVar3 = PeekMatchLpar(this,Type);
      if (bVar3) {
        ((local_120._M_head_impl)->event).decl.has_func_type = true;
        RVar4 = ParseTypeUseOpt(this,&((local_120._M_head_impl)->event).decl);
        local_118._0_8_ = local_120._M_head_impl;
      }
      else {
        RVar4 = ParseFuncSignature(this,&((local_120._M_head_impl)->event).decl.sig,
                                   (BindingHash *)
                                   &local_120._M_head_impl[1].
                                    super_ImportMixin<(wabt::ExternalKind)4>.super_Import.
                                    module_name.field_2);
        local_118._0_8_ = local_120._M_head_impl;
        if (RVar4.enum_ == Error) goto LAB_00179ad7;
        std::__cxx11::string::string((string *)local_118,"param",&local_121);
        std::__cxx11::string::string((string *)(local_118 + 0x20),"result",&local_122);
        local_d8 = 0;
        uStack_d0 = 0;
        local_c8 = 0;
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        _M_range_initialize<std::__cxx11::string_const*>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_d8,
                   (string *)local_118,&local_d8);
        RVar4 = ErrorIfLpar(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)&local_d8,(char *)0x0);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_d8);
        lVar7 = 0x20;
        do {
          std::__cxx11::string::_M_dispose();
          lVar7 = lVar7 + -0x20;
          local_118._0_8_ = local_120._M_head_impl;
        } while (lVar7 != -0x20);
      }
      if ((RVar4.enum_ != Error) &&
         (local_120._M_head_impl = (EventImport *)local_118._0_8_, RVar4 = Expect(this,Rpar),
         local_118._0_8_ = local_120._M_head_impl, RVar4.enum_ != Error)) {
        this_00 = (wabt *)local_118;
        args = &local_120;
        MakeUnique<wabt::ImportModuleField,std::unique_ptr<wabt::FuncImport,std::default_delete<wabt::FuncImport>>,wabt::Location&>
                  (this_00,(unique_ptr<wabt::FuncImport,_std::default_delete<wabt::FuncImport>_> *)
                           args,&loc);
        goto LAB_00179c1b;
      }
    }
LAB_00179ad7:
    if ((EventImport *)local_118._0_8_ != (EventImport *)0x0) {
      (*(((EventImport *)local_118._0_8_)->super_ImportMixin<(wabt::ExternalKind)4>).super_Import.
        _vptr_Import[1])();
    }
    RVar4.enum_ = Error;
  }
LAB_00179ae5:
  std::__cxx11::string::_M_dispose();
LAB_00179aef:
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  return (Result)RVar4.enum_;
}

Assistant:

Result WastParser::ParseImportModuleField(Module* module) {
  WABT_TRACE(ParseImportModuleField);
  EXPECT(Lpar);
  Location loc = GetLocation();
  CheckImportOrdering(module);
  EXPECT(Import);
  std::string module_name;
  std::string field_name;
  CHECK_RESULT(ParseQuotedText(&module_name));
  CHECK_RESULT(ParseQuotedText(&field_name));
  EXPECT(Lpar);

  std::unique_ptr<ImportModuleField> field;
  std::string name;

  switch (Peek()) {
    case TokenType::Func: {
      Consume();
      ParseBindVarOpt(&name);
      auto import = MakeUnique<FuncImport>(name);
      if (PeekMatchLpar(TokenType::Type)) {
        import->func.decl.has_func_type = true;
        CHECK_RESULT(ParseTypeUseOpt(&import->func.decl));
        EXPECT(Rpar);
      } else {
        CHECK_RESULT(
            ParseFuncSignature(&import->func.decl.sig, &import->func.bindings));
        CHECK_RESULT(ErrorIfLpar({"param", "result"}));
        EXPECT(Rpar);
      }
      field = MakeUnique<ImportModuleField>(std::move(import), loc);
      break;
    }

    case TokenType::Table: {
      Consume();
      ParseBindVarOpt(&name);
      auto import = MakeUnique<TableImport>(name);
      CHECK_RESULT(ParseLimits(&import->table.elem_limits));
      CHECK_RESULT(ParseRefType(&import->table.elem_type));
      EXPECT(Rpar);
      field = MakeUnique<ImportModuleField>(std::move(import), loc);
      break;
    }

    case TokenType::Memory: {
      Consume();
      ParseBindVarOpt(&name);
      auto import = MakeUnique<MemoryImport>(name);
      CHECK_RESULT(ParseLimits(&import->memory.page_limits));
      EXPECT(Rpar);
      field = MakeUnique<ImportModuleField>(std::move(import), loc);
      break;
    }

    case TokenType::Global: {
      Consume();
      ParseBindVarOpt(&name);
      auto import = MakeUnique<GlobalImport>(name);
      CHECK_RESULT(ParseGlobalType(&import->global));
      EXPECT(Rpar);
      field = MakeUnique<ImportModuleField>(std::move(import), loc);
      break;
    }

    case TokenType::Event: {
      Consume();
      ParseBindVarOpt(&name);
      auto import = MakeUnique<EventImport>(name);
      CHECK_RESULT(ParseTypeUseOpt(&import->event.decl));
      CHECK_RESULT(ParseUnboundFuncSignature(&import->event.decl.sig));
      EXPECT(Rpar);
      field = MakeUnique<ImportModuleField>(std::move(import), loc);
      break;
    }

    default:
      return ErrorExpected({"an external kind"});
  }

  field->import->module_name = module_name;
  field->import->field_name = field_name;

  module->AppendField(std::move(field));
  EXPECT(Rpar);
  return Result::Ok;
}